

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O1

void xSAT_SolverDestroy(xSAT_Solver_t *s)

{
  xSAT_Mem_t *__ptr;
  Vec_Int_t *pVVar1;
  xSAT_VecWatchList_t *pxVar2;
  xSAT_WatchList_t *pxVar3;
  void *pvVar4;
  xSAT_Heap_t *__ptr_00;
  Vec_Str_t *pVVar5;
  xSAT_BQueue_t *pxVar6;
  long lVar7;
  long lVar8;
  
  __ptr = s->pMemory;
  if (__ptr->pData != (uint *)0x0) {
    free(__ptr->pData);
    __ptr->pData = (uint *)0x0;
  }
  if (__ptr != (xSAT_Mem_t *)0x0) {
    free(__ptr);
  }
  pVVar1 = s->vClauses;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vLearnts;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pxVar2 = s->vWatches;
  if (0 < pxVar2->nSize) {
    lVar8 = 8;
    lVar7 = 0;
    do {
      pxVar3 = pxVar2->pArray;
      pvVar4 = *(void **)((long)&pxVar3->nCap + lVar8);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)((long)&pxVar3->nCap + lVar8) = 0;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < pxVar2->nSize);
  }
  if (pxVar2->pArray != (xSAT_WatchList_t *)0x0) {
    free(pxVar2->pArray);
    pxVar2->pArray = (xSAT_WatchList_t *)0x0;
  }
  if (pxVar2 != (xSAT_VecWatchList_t *)0x0) {
    free(pxVar2);
  }
  pxVar2 = s->vBinWatches;
  if (0 < pxVar2->nSize) {
    lVar8 = 8;
    lVar7 = 0;
    do {
      pxVar3 = pxVar2->pArray;
      pvVar4 = *(void **)((long)&pxVar3->nCap + lVar8);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)((long)&pxVar3->nCap + lVar8) = 0;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar7 < pxVar2->nSize);
  }
  if (pxVar2->pArray != (xSAT_WatchList_t *)0x0) {
    free(pxVar2->pArray);
    pxVar2->pArray = (xSAT_WatchList_t *)0x0;
  }
  if (pxVar2 != (xSAT_VecWatchList_t *)0x0) {
    free(pxVar2);
  }
  __ptr_00 = s->hOrder;
  pVVar1 = __ptr_00->vIndices;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = __ptr_00->vHeap;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (__ptr_00 != (xSAT_Heap_t *)0x0) {
    free(__ptr_00);
  }
  pVVar1 = s->vTrailLim;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vTrail;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vTagged;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vStack;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar5 = s->vSeen;
  if (pVVar5->pArray != (char *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (char *)0x0;
  }
  if (pVVar5 != (Vec_Str_t *)0x0) {
    free(pVVar5);
  }
  pVVar1 = s->vLearntClause;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vLastDLevel;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vActivity;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar5 = s->vPolarity;
  if (pVVar5->pArray != (char *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (char *)0x0;
  }
  if (pVVar5 != (Vec_Str_t *)0x0) {
    free(pVVar5);
  }
  pVVar5 = s->vTags;
  if (pVVar5->pArray != (char *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (char *)0x0;
  }
  if (pVVar5 != (Vec_Str_t *)0x0) {
    free(pVVar5);
  }
  pVVar5 = s->vAssigns;
  if (pVVar5->pArray != (char *)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (char *)0x0;
  }
  if (pVVar5 != (Vec_Str_t *)0x0) {
    free(pVVar5);
  }
  pVVar1 = s->vLevels;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vReasons;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = s->vStamp;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pxVar6 = s->bqLBD;
  if (pxVar6->pData != (uint *)0x0) {
    free(pxVar6->pData);
    pxVar6->pData = (uint *)0x0;
  }
  if (pxVar6 != (xSAT_BQueue_t *)0x0) {
    free(pxVar6);
  }
  pxVar6 = s->bqTrail;
  if (pxVar6->pData != (uint *)0x0) {
    free(pxVar6->pData);
    pxVar6->pData = (uint *)0x0;
  }
  if (pxVar6 != (xSAT_BQueue_t *)0x0) {
    free(pxVar6);
  }
  free(s);
  return;
}

Assistant:

void xSAT_SolverDestroy( xSAT_Solver_t * s )
{
    xSAT_MemFree( s->pMemory );
    Vec_IntFree( s->vClauses );
    Vec_IntFree( s->vLearnts );
    xSAT_VecWatchListFree( s->vWatches );
    xSAT_VecWatchListFree( s->vBinWatches );

    xSAT_HeapFree(s->hOrder);
    Vec_IntFree( s->vTrailLim );
    Vec_IntFree( s->vTrail );
    Vec_IntFree( s->vTagged );
    Vec_IntFree( s->vStack );

    Vec_StrFree( s->vSeen );
    Vec_IntFree( s->vLearntClause );
    Vec_IntFree( s->vLastDLevel );

    Vec_IntFree( s->vActivity );
    Vec_StrFree( s->vPolarity );
    Vec_StrFree( s->vTags );
    Vec_StrFree( s->vAssigns );
    Vec_IntFree( s->vLevels );
    Vec_IntFree( s->vReasons );
    Vec_IntFree( s->vStamp );

    xSAT_BQueueFree(s->bqLBD);
    xSAT_BQueueFree(s->bqTrail);

    ABC_FREE(s);
}